

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

int Pdr_SetIsInit(Pdr_Set_t *pCube,int iRemove)

{
  ulong uVar1;
  
  if (0 < (long)pCube->nLits) {
    uVar1 = 0;
    do {
      if (*(uint *)(&pCube->field_0x14 + uVar1 * 4) == 0xffffffff) {
        __assert_fail("pCube->Lits[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                      ,0x15a,"int Pdr_SetIsInit(Pdr_Set_t *, int)");
      }
      if (((uint)iRemove != uVar1) && ((*(uint *)(&pCube->field_0x14 + uVar1 * 4) & 1) == 0)) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((long)pCube->nLits != uVar1);
  }
  return 1;
}

Assistant:

int Pdr_SetIsInit( Pdr_Set_t * pCube, int iRemove )
{
    int i;
    for ( i = 0; i < pCube->nLits; i++ )
    {
        assert( pCube->Lits[i] != -1 );
        if ( i == iRemove )
            continue;
        if ( lit_sign( pCube->Lits[i] ) == 0 )
            return 0;
    }
    return 1;
}